

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

double erfinv(double target)

{
  ostream *poVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (ABS(target) <= 1.0) {
    dVar5 = 0.0;
    if ((target != 0.0) || (NAN(target))) {
      if ((target != 1.0) || (NAN(target))) {
        if ((target != -1.0) || (NAN(target))) {
          dVar7 = 0.4;
          uVar2 = 1;
          iVar3 = 0xf4241;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              return dVar5;
            }
            dVar6 = erf(dVar5);
            bVar4 = uVar2 == (-(uint)(dVar6 <= target) | 1);
            if (bVar4) {
              uVar2 = (uint)(dVar6 <= target) * 2 - 1;
            }
            dVar7 = dVar7 * *(double *)(&DAT_00144c60 + (ulong)bVar4 * 8);
            dVar5 = dVar5 + (double)(int)uVar2 * dVar7;
          } while (1e-09 <= dVar7);
        }
        else {
          dVar5 = -1e+24;
        }
      }
      else {
        dVar5 = 1e+24;
      }
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"argument for erfinv outside of domain");
    std::endl<char,std::char_traits<char>>(poVar1);
    dVar5 = 0.0;
  }
  return dVar5;
}

Assistant:

double erfinv(double target)
{
	double stepsize = 0.4; // starting stepsize
	double source = 0.0;
	int direction = 1; // current direction 1-up, -1-down
	double error = 0.000000001;
	
	if( target > 1.0 || target < -1.0 ) {
		cout << "argument for erfinv outside of domain" << endl;
		return 0.0; // I mean NaN
	}
	if( target==0.0 ) return 0.0;
	if( target==1.0 ) return 1e24; // replacement for inf
	if( target==-1.0 ) return -1e24; // replacement for -inf
	
	int k;
	for( k=0; k<1000000; k++) {
		double current = erf( source );
		
		if(current > target) {
			if(direction == 1) {
				// too large and direction up - decrease stepsize and turn
				stepsize *= 0.6;
				direction *= -1;
			} else
				// too large and direction down - increase stepsize
				stepsize *= 1.1;
		} else {
			if(direction == -1) {
				// too small and direction down - decrease stepsize and turn
				stepsize *= 0.6;
				direction *= -1;
			} else
				// too small and direction up - increase stepsize
				stepsize *= 1.1;
		}
		source += direction * stepsize;
		
		// early stopping
		if( stepsize < error )
			break;
	}
/*	// note
	cout << "erfinv(" << target 
		<< ") = " << source 
		<< ", stepsize = " << stepsize 
		<< ", " << k << " steps, "
		<< " error = " << erf(source) - target << endl;
*/	
	return source;
}